

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O0

void __thiscall
pbrt::DigitPermutation::DigitPermutation
          (DigitPermutation *this,int base,uint32_t seed,Allocator alloc)

{
  uint p;
  int iVar1;
  unsigned_short *puVar2;
  uint16_t *puVar3;
  undefined8 in_RCX;
  uint in_EDX;
  char *unaff_RBX;
  uint32_t in_ESI;
  DigitPermutation *in_RDI;
  LogLevel unaff_retaddr;
  char (*in_stack_00000010) [5];
  int *in_stack_00000018;
  char (*in_stack_00000020) [6];
  int *in_stack_00000028;
  int digitValue;
  uint32_t digitSeed;
  int digitIndex;
  Float invBaseN;
  Float invBase;
  int vb;
  int va;
  size_t in_stack_ffffffffffffff88;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff90;
  uint32_t local_3c;
  int local_34;
  float local_30;
  
  in_RDI->base = in_ESI;
  if (0xffff < (int)in_ESI) {
    LogFatal<char_const(&)[5],char_const(&)[6],char_const(&)[5],int&,char_const(&)[6],int&>
              (unaff_retaddr,unaff_RBX,(int)((ulong)in_RCX >> 0x20),(char *)in_RDI,
               (char (*) [5])CONCAT44(in_ESI,in_EDX),(char (*) [6])CONCAT44(in_ESI,0x10000),
               in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028);
  }
  in_RDI->nDigits = 0;
  for (local_30 = 1.0; 1.0 - local_30 < 1.0; local_30 = (1.0 / (float)(int)in_ESI) * local_30) {
    in_RDI->nDigits = in_RDI->nDigits + 1;
  }
  puVar2 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<unsigned_short>
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->permutations = puVar2;
  for (local_34 = 0; local_34 < in_RDI->nDigits; local_34 = local_34 + 1) {
    p = in_ESI * 0x20 + local_34 ^ in_EDX;
    for (local_3c = 0; (int)local_3c < (int)in_ESI; local_3c = local_3c + 1) {
      iVar1 = PermutationElement(local_3c,in_ESI,p);
      puVar3 = Perm(in_RDI,local_34,local_3c);
      *puVar3 = (uint16_t)iVar1;
    }
  }
  return;
}

Assistant:

DigitPermutation(int base, uint32_t seed, Allocator alloc) : base(base) {
        CHECK_LT(base, 65536);  // uint16_t
        // Compute number of digits needed for _base_
        nDigits = 0;
        Float invBase = (Float)1 / (Float)base;
        Float invBaseN = 1;
        while (1 - invBaseN < 1) {
            ++nDigits;
            invBaseN *= invBase;
        }

        permutations = alloc.allocate_object<uint16_t>(nDigits * base);
        for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
            // Compute random permutation for _digitIndex_
            uint32_t digitSeed = (base * 32 + digitIndex) ^ seed;
            for (int digitValue = 0; digitValue < base; ++digitValue)
                Perm(digitIndex, digitValue) =
                    PermutationElement(digitValue, base, digitSeed);
        }
    }